

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::BoundExportData::Deserialize(BoundExportData *this,Deserializer *deserializer)

{
  uint uVar1;
  pointer pBVar2;
  _Head_base<0UL,_duckdb::BoundExportData_*,_false> local_70;
  vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_> local_68;
  vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_> local_48;
  
  local_70._M_head_impl = (BoundExportData *)operator_new(0x28);
  ((local_70._M_head_impl)->super_ParseInfo).info_type = BOUND_EXPORT_DATA;
  ((local_70._M_head_impl)->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)&PTR__BoundExportData_0197c100;
  ((local_70._M_head_impl)->data).
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_70._M_head_impl)->data).
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_70._M_head_impl)->data).
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar2 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>::
           operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                       *)&local_70);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"data");
  if ((char)uVar1 == '\0') {
    local_48.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pBVar2->data).
         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pBVar2->data).
         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pBVar2->data).
         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pBVar2->data).
    super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar2->data).
    super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar2->data).
    super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>::~vector
              (&local_48);
  }
  else {
    Deserializer::Read<duckdb::vector<duckdb::ExportedTableInfo,true>>
              ((type *)&local_68,deserializer);
    local_48.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pBVar2->data).
         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pBVar2->data).
         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pBVar2->data).
         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pBVar2->data).
    super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pBVar2->data).
    super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pBVar2->data).
    super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>::~vector
              (&local_48);
  }
  ::std::vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>::~vector
            (&local_68);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_70._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> BoundExportData::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BoundExportData>(new BoundExportData());
	deserializer.ReadPropertyWithDefault<vector<ExportedTableInfo>>(200, "data", result->data);
	return std::move(result);
}